

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_main.cc
# Opt level: O3

int main(void)

{
  size_t sVar1;
  double *pdVar2;
  pointer ppVVar3;
  pointer ppVar4;
  int iVar5;
  undefined4 extraout_var;
  Variable<double> *v;
  ostream *poVar6;
  undefined4 extraout_var_00;
  type *nn_input_1;
  pointer ppVVar7;
  pointer ppVar8;
  type *nn_input;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  string_view path;
  initializer_list<double> __l_01;
  DataLoader dataloader;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  x_and_ys;
  SGDOptimizer optimizer;
  TensorShape output_shape;
  TensorShape input_shape;
  MyNN mynn;
  allocator_type local_1f1;
  double local_1f0;
  int local_1e4;
  DataLoader local_1e0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1c8;
  SGDOptimizer local_1b0;
  double local_188;
  vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> local_180;
  vector<double,_std::allocator<double>_> local_168;
  unsigned_long local_150;
  size_t sStack_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_140;
  function<double_()> local_128;
  TensorShape local_108;
  TensorShape local_d8;
  size_t local_b0;
  size_t sStack_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  double local_88;
  double dStack_80;
  undefined8 local_78;
  NN local_70;
  
  MyNN::MyNN((MyNN *)&local_70);
  yyml::nn::NN::Parameters(&local_180,&local_70);
  yyml::nn::SGDOptimizer::SGDOptimizer(&local_1b0,&local_180,0.001);
  if (local_180.
      super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.
                    super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.
                          super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.
                          super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_150 = 1;
  sStack_148 = 2;
  local_b0 = 2;
  sStack_a8 = 2;
  __l._M_len = 2;
  __l._M_array = &local_150;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a0,__l,(allocator_type *)&local_1e0);
  local_1e0.data_.
  super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  local_1e0.data_.
  super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
  local_150 = 2;
  sStack_148 = 1;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_1e0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_140,__l_00,(allocator_type *)&local_1c8);
  local_d8.dim = local_b0;
  local_d8.total = sStack_a8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_d8.dims,&local_a0);
  local_108.dim = local_150;
  local_108.total = sStack_148;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_108.dims,&local_140);
  path._M_str = "2d_normal_data.txt";
  path._M_len = 0x12;
  yyml::DataLoader::DataLoader(&local_1e0,path,&local_d8,&local_108);
  if (local_108.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_128.super__Function_base._M_functor._8_8_ = 0;
  local_128.super__Function_base._M_functor._M_unused._M_object =
       yyml::RandomNumberGenerator::NormalDistribution;
  local_128._M_invoker = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_128.super__Function_base._M_manager =
       std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  yyml::nn::OptimizerInterface::Apply(&local_1b0.super_OptimizerInterface,&local_128);
  if (local_128.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_128.super__Function_base._M_manager)
              ((_Any_data *)&local_128,(_Any_data *)&local_128,__destroy_functor);
  }
  iVar5 = 0;
  do {
    ppVar4 = local_1e0.data_.
             super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1e4 = iVar5;
    if (local_1e0.data_.
        super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_1e0.data_.
        super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1f0 = 0.0;
    }
    else {
      local_1f0 = 0.0;
      ppVVar7 = local_1b0.super_OptimizerInterface.parameters_.
                super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVVar3 = local_1b0.super_OptimizerInterface.parameters_.
                super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppVar8 = local_1e0.data_.
               super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        for (; ppVVar7 != ppVVar3; ppVVar7 = ppVVar7 + 1) {
          sVar1 = ((*ppVVar7)->grads_).shape_.total;
          if (sVar1 != 0) {
            memset(((*ppVVar7)->grads_).data_,0,sVar1 << 3);
          }
        }
        iVar5 = (**local_70._vptr_NN)(&local_70,ppVar8);
        v = LossFunc((Variable<double> *)CONCAT44(extraout_var,iVar5),&ppVar8->second);
        local_188 = *(v->values_).data_;
        yyml::nn::Backward<double>(v);
        local_1f0 = local_1f0 + local_188;
        yyml::nn::SGDOptimizer::Step(&local_1b0);
        ppVar8 = ppVar8 + 1;
        ppVVar7 = local_1b0.super_OptimizerInterface.parameters_.
                  super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVVar3 = local_1b0.super_OptimizerInterface.parameters_.
                  super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (ppVar8 != ppVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TensorCreated: ",0xf);
    iVar5 = local_1e4;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TensorCopied: ",0xe);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TensorMoved: ",0xd);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TensorDestroyed: ",0x11);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loss: ",6);
    poVar6 = std::ostream::_M_insert<double>(local_1f0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    ppVar4 = local_1e0.data_.
             super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 100);
  local_1c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1e0.data_.
      super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1e0.data_.
      super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar8 = local_1e0.data_.
             super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar5 = (**local_70._vptr_NN)(&local_70,ppVar8);
      pdVar2 = (ppVar8->first).values_.data_;
      local_88 = *pdVar2;
      dStack_80 = pdVar2[1];
      local_78 = **(undefined8 **)(CONCAT44(extraout_var_00,iVar5) + 0x28);
      __l_01._M_len = 3;
      __l_01._M_array = &local_88;
      std::vector<double,_std::allocator<double>_>::vector(&local_168,__l_01,&local_1f1);
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)&local_1c8,&local_168);
      if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != ppVar4);
  }
  OutputResult(&local_1c8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1c8);
  std::
  vector<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
  ::~vector(&local_1e0.data_);
  if (local_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1b0.super_OptimizerInterface._vptr_OptimizerInterface =
       (_func_int **)&PTR___cxa_pure_virtual_0010ed58;
  if (local_1b0.super_OptimizerInterface.parameters_.
      super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.super_OptimizerInterface.parameters_.
                    super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.super_OptimizerInterface.parameters_.
                          super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.super_OptimizerInterface.parameters_.
                          super__Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_70._vptr_NN = (_func_int **)&PTR___cxa_pure_virtual_0010ec00;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_70.layers_._M_h);
  return 0;
}

Assistant:

int main() {
  MyNN mynn;
  SGDOptimizer optimizer(mynn.Parameters(), 0.001);
  TensorShape input_shape{1, 2}, output_shape{1, 1};
  {
    DataLoader dataloader("2d_normal_data.txt", input_shape, output_shape);
    optimizer.Apply(RandomNumberGenerator::NormalDistribution);

    for (int i = 0; i < 100; i++) {
      double iter_loss = 0;
      for (auto& [nn_input, label] : dataloader) {
        optimizer.ZeroGrad();
        auto* nn_output = mynn(&nn_input);
        auto* loss = LossFunc(nn_output, &label);
        iter_loss += loss->values_.data_[0];
        loss->Backward();
        optimizer.Step();
      }
      std::cout << "TensorCreated: " << Tensor<double>::created_ << std::endl;
      std::cout << "TensorCopied: " << Tensor<double>::copied_ << std::endl;
      std::cout << "TensorMoved: " << Tensor<double>::moved_ << std::endl;
      std::cout << "TensorDestroyed: " << Tensor<double>::destroyed_
                << std::endl;
      std::cout << "Loss: " << iter_loss << std::endl;
    }
    std::vector<std::vector<double>> x_and_ys;
    for (auto& [nn_input, _] : dataloader) {
      auto* nn_output = mynn(&nn_input);
      x_and_ys.emplace_back(std::vector<double>{nn_input.values_.data_[0],
                                                nn_input.values_.data_[1],
                                                nn_output->values_.data_[0]});
    }
    OutputResult(x_and_ys);
  }
}